

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.cpp
# Opt level: O2

int rsa_encrypt_wrap(mbedtls_pk_context *pk,uchar *input,size_t ilen,uchar *output,size_t *olen,
                    size_t osize,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_rsa_context *ctx;
  int iVar1;
  size_t sVar2;
  
  ctx = (mbedtls_rsa_context *)pk->pk_ctx;
  sVar2 = mbedtls_rsa_get_len(ctx);
  *olen = sVar2;
  if (osize < sVar2) {
    return -0x4400;
  }
  iVar1 = mbedtls_rsa_pkcs1_encrypt(ctx,f_rng,p_rng,ilen,input,output);
  return iVar1;
}

Assistant:

static int rsa_encrypt_wrap(mbedtls_pk_context *pk,
                            const unsigned char *input, size_t ilen,
                            unsigned char *output, size_t *olen, size_t osize,
                            int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    mbedtls_rsa_context *rsa = (mbedtls_rsa_context *) pk->pk_ctx;
    *olen = mbedtls_rsa_get_len(rsa);

    if (*olen > osize) {
        return MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE;
    }

    return mbedtls_rsa_pkcs1_encrypt(rsa, f_rng, p_rng,
                                     ilen, input, output);
}